

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::ClearHasBit(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  FieldOptions *this_00;
  LogMessage *pLVar3;
  uint32_t *puVar4;
  uint32_t index;
  LogMessage local_38;
  Voidify local_21;
  FieldDescriptor *local_20;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_20 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  this_00 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::weak(this_00);
  if (bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xc76,"!field->options().weak()");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  uVar2 = internal::ReflectionSchema::HasBitIndex(&this->schema_,local_20);
  if (uVar2 != 0xffffffff) {
    puVar4 = MutableHasBits(this,(Message *)field_local);
    puVar4[uVar2 >> 5] = (1 << ((byte)uVar2 & 0x1f) ^ 0xffffffffU) & puVar4[uVar2 >> 5];
  }
  return;
}

Assistant:

void Reflection::ClearHasBit(Message* message,
                             const FieldDescriptor* field) const {
  ABSL_DCHECK(!field->options().weak());
  const uint32_t index = schema_.HasBitIndex(field);
  if (index == static_cast<uint32_t>(-1)) return;
  MutableHasBits(message)[index / 32] &=
      ~(static_cast<uint32_t>(1) << (index % 32));
}